

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  TargetType TVar6;
  char *pcVar7;
  LinkClosure *pLVar8;
  char *pcVar9;
  ArtifactType artifact_00;
  string ll;
  string fw_prefix;
  string configPostfix;
  size_type __dnew_1;
  string local_d0;
  string *local_b0;
  char *local_a8;
  string local_a0;
  char *local_80;
  undefined8 local_78;
  char local_70;
  undefined7 uStack_6f;
  string local_60;
  string *local_40;
  size_type local_38;
  
  local_b0 = config;
  TVar6 = cmTarget::GetType(this->Target);
  if ((((TVar6 != STATIC_LIBRARY) &&
       (TVar6 = cmTarget::GetType(this->Target), TVar6 != SHARED_LIBRARY)) &&
      (TVar6 = cmTarget::GetType(this->Target), TVar6 != MODULE_LIBRARY)) &&
     (TVar6 = cmTarget::GetType(this->Target), TVar6 != EXECUTABLE)) {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    cmTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_assign((string *)outBase);
    outSuffix->_M_string_length = 0;
    *(outSuffix->_M_dataplus)._M_p = '\0';
    return;
  }
  paVar1 = &local_a0.field_2;
  if (artifact == ImportLibraryArtifact) {
    pcVar2 = this->Makefile;
    local_60._M_dataplus._M_p = (pointer)0x1b;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    local_a0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_60);
    local_a0.field_2._M_allocated_capacity = (size_type)local_60._M_dataplus._M_p;
    builtin_strncpy(local_a0._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_a0._M_string_length = (size_type)local_60._M_dataplus._M_p;
    local_a0._M_dataplus._M_p[(long)local_60._M_dataplus._M_p] = '\0';
    pcVar7 = cmMakefile::GetDefinition(pcVar2,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1))
      ;
    }
    if (pcVar7 == (char *)0x0) {
      outPrefix->_M_string_length = 0;
      *(outPrefix->_M_dataplus)._M_p = '\0';
      outBase->_M_string_length = 0;
      *(outBase->_M_dataplus)._M_p = '\0';
      outSuffix->_M_string_length = 0;
      *(outSuffix->_M_dataplus)._M_p = '\0';
      return;
    }
  }
  pLVar8 = GetLinkClosure(this,local_b0);
  pcVar3 = (pLVar8->LinkerLanguage)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar3,pcVar3 + (pLVar8->LinkerLanguage)._M_string_length);
  pcVar7 = GetFilePrefixInternal(this,artifact,&local_a0);
  pcVar9 = GetFileSuffixInternal(this,artifact,&local_a0);
  TVar6 = cmTarget::GetType(this->Target);
  artifact_00 = artifact;
  if ((TVar6 != SHARED_LIBRARY) &&
     (TVar6 = cmTarget::GetType(this->Target), TVar6 != MODULE_LIBRARY)) {
    TVar6 = cmTarget::GetType(this->Target);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar6 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  local_a8 = pcVar9;
  local_40 = outSuffix;
  GetFilePostfix(&local_60,this,local_b0);
  local_80 = &local_70;
  local_78 = 0;
  local_70 = '\0';
  bVar5 = IsFrameworkOnApple(this);
  if (bVar5) {
    GetFrameworkDirectory(&local_d0,this,local_b0,ContentLevel);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_80);
    local_a8 = (char *)0x0;
    pcVar7 = local_80;
  }
  bVar5 = IsCFBundleOnApple(this);
  if (bVar5) {
    GetCFBundleDirectory(&local_d0,this,local_b0,FullLevel);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_80);
    local_a8 = (char *)0x0;
    pcVar7 = local_80;
  }
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  pcVar9 = (char *)outPrefix->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)outPrefix,0,pcVar9,(ulong)pcVar7);
  GetOutputName(&local_d0,this,local_b0,artifact_00);
  std::__cxx11::string::_M_append((char *)outBase,(ulong)local_d0._M_dataplus._M_p);
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)outBase,(ulong)local_60._M_dataplus._M_p);
  local_d0.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_d0.field_2._8_2_ = 0x4e;
  local_d0._M_string_length = 9;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  pcVar7 = GetProperty(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (((pcVar7 != (char *)0x0) &&
      (TVar6 = cmTarget::GetType(this->Target), artifact != ImportLibraryArtifact)) &&
     (TVar6 == SHARED_LIBRARY)) {
    pcVar2 = this->Makefile;
    local_38 = 0x26;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    local_d0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_38);
    local_d0.field_2._M_allocated_capacity = local_38;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x10) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x11) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x12) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x13) = 'Y';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x14) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x15) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x16) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x17) = 'M';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x18) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x19) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1a) = 'W';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1b) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1c) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1d) = 'H';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1e) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1f) = 'V';
    *(undefined8 *)local_d0._M_dataplus._M_p = 0x48535f454b414d43;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 8) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 9) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 10) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0xb) = 'D';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0xc) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0xd) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0xe) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0xf) = 'B';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1e) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x1f) = 'V';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x20) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x21) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x22) = 'S';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x23) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x24) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p + 0x25) = 'N';
    local_d0._M_string_length = local_38;
    local_d0._M_dataplus._M_p[local_38] = '\0';
    bVar5 = cmMakefile::IsOn(pcVar2,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      std::__cxx11::string::append((char *)outBase);
      std::__cxx11::string::append((char *)outBase);
    }
  }
  psVar4 = local_40;
  pcVar7 = "";
  if (local_a8 != (char *)0x0) {
    pcVar7 = local_a8;
  }
  pcVar9 = (char *)local_40->_M_string_length;
  strlen(pcVar7);
  std::__cxx11::string::_M_replace((ulong)psVar4,0,pcVar9,(ulong)pcVar7);
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1));
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // retrieve prefix and suffix
  std::string ll = this->GetLinkerLanguage(config);
  const char* targetPrefix = this->GetFilePrefixInternal(artifact, ll);
  const char* targetSuffix = this->GetFileSuffixInternal(artifact, ll);

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const std::string configPostfix = this->GetFilePostfix(config);

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix;

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}